

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void std::__relocate_object_a<cnn::Tensor,cnn::Tensor,std::allocator<cnn::Tensor>>
               (Tensor *__dest,Tensor *__orig,allocator<cnn::Tensor> *__alloc)

{
  pointer pTVar1;
  pointer pTVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float *pfVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  uVar3 = *(undefined8 *)((__orig->d).d + 4);
  uVar4 = *(undefined8 *)((__orig->d).d + 6);
  uVar5 = *(undefined8 *)&(__orig->d).bd;
  pfVar6 = __orig->v;
  uVar7 = *(undefined8 *)(__orig->d).d;
  uVar8 = *(undefined8 *)((__orig->d).d + 2);
  uVar9 = *(undefined8 *)((__orig->d).d + 4);
  uVar10 = *(undefined8 *)((__orig->d).d + 6);
  pTVar1 = (__orig->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (__orig->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((__dest->d).d + 4) = uVar3;
  *(undefined8 *)((__dest->d).d + 6) = uVar4;
  *(undefined8 *)&(__dest->d).bd = uVar5;
  __dest->v = pfVar6;
  *(undefined8 *)(__dest->d).d = uVar7;
  *(undefined8 *)((__dest->d).d + 2) = uVar8;
  *(undefined8 *)((__dest->d).d + 4) = uVar9;
  *(undefined8 *)((__dest->d).d + 6) = uVar10;
  pTVar2 = (__orig->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__dest->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__orig->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__dest->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar2;
  (__dest->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar1;
  (__orig->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (__orig->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&__orig->bs);
  return;
}

Assistant:

Tensor(const Dim& d, float* v) : d(d), v(v) {}